

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_parse_certificate(mbedtls_ssl_context *ssl)

{
  uint32_t *puVar1;
  uint8_t uVar2;
  byte bVar3;
  uint uVar4;
  uchar *puVar5;
  mbedtls_ssl_config *pmVar6;
  bool bVar7;
  uchar uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  mbedtls_x509_crt *crt;
  ulong uVar12;
  void **ppvVar13;
  ushort uVar14;
  char *format;
  ulong uVar15;
  mbedtls_x509_crt *pmVar16;
  _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr **pp_Var17;
  mbedtls_pk_context local_68;
  mbedtls_ssl_ciphersuite_t *local_48;
  mbedtls_x509_crt *local_40;
  mbedtls_x509_crt *local_38;
  
  uVar2 = ssl->conf->authmode;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,0x1d56,"=> parse certificate");
  bVar3 = ssl->handshake->ciphersuite_info->key_exchange;
  if ((bVar3 < 0xb) && ((0x69eU >> (bVar3 & 0x1f) & 1) != 0)) {
    if (ssl->conf->endpoint == '\x01') {
      if (bVar3 != 7) {
        if (uVar2 != '\0') goto LAB_00212799;
        ssl->session_negotiate->verify_result = 0x80;
      }
      goto LAB_002128c0;
    }
LAB_00212799:
    iVar9 = mbedtls_ssl_read_record(ssl,1);
    if (iVar9 == 0) {
      if ((((ssl->conf->endpoint != '\0') &&
           (uVar11 = (ulong)(ssl->conf->transport == '\x01') * 8, ssl->in_hslen == uVar11 + 7)) &&
          (ssl->in_msgtype == 0x16)) &&
         ((puVar5 = ssl->in_msg, *puVar5 == '\v' &&
          (uVar11 = uVar11 | 4, puVar5[uVar11 + 2] == '\0' && *(short *)(puVar5 + uVar11) == 0)))) {
        crt = (mbedtls_x509_crt *)0x0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1c29,"peer has no certificate");
        ssl->session_negotiate->verify_result = 0x40;
        iVar9 = -0x7480;
        if (uVar2 == '\x01') {
          iVar9 = 0;
        }
        goto LAB_002128e5;
      }
      ssl_clear_peer_cert(ssl->session_negotiate);
      crt = (mbedtls_x509_crt *)calloc(1,0x2f0);
      if (crt == (mbedtls_x509_crt *)0x0) {
        crt = (mbedtls_x509_crt *)0x0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1d81,"alloc(%zu bytes) failed",0x2f0);
        mbedtls_ssl_send_alert_message(ssl,'\x02','P');
        iVar9 = -0x7f00;
        goto LAB_002128e5;
      }
      mbedtls_x509_crt_init(crt);
      if (ssl->in_msgtype == 0x16) {
        puVar5 = ssl->in_msg;
        if (*puVar5 != '\v') goto LAB_0021297b;
        uVar12 = ssl->in_hslen;
        uVar11 = (ulong)(ssl->conf->transport == '\x01') * 8;
        local_38 = crt;
        if (uVar12 < uVar11 + 10) {
          iVar10 = 0x1ba5;
LAB_00212a69:
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,iVar10,"bad certificate message");
          mbedtls_ssl_send_alert_message(ssl,'\x02','2');
          iVar9 = -0x7300;
          pmVar16 = local_38;
        }
        else {
          uVar15 = uVar11 | 4;
          if ((puVar5[uVar15] != '\0') ||
             (uVar12 != (ushort)(*(ushort *)(puVar5 + uVar15 + 1) << 8 |
                                *(ushort *)(puVar5 + uVar15 + 1) >> 8) + uVar15 + 3)) {
            iVar10 = 0x1bb4;
            goto LAB_00212a69;
          }
          uVar11 = uVar11 | 7;
          while (uVar11 < uVar12) {
            uVar15 = uVar11 + 3;
            if (uVar12 < uVar15) {
              iVar10 = 0x1bc1;
              goto LAB_00212a69;
            }
            puVar5 = ssl->in_msg;
            if (puVar5[uVar11] != '\0') {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                         ,0x1bca,"bad certificate message");
              mbedtls_ssl_send_alert_message(ssl,'\x02','+');
              iVar9 = -0x7a00;
              pmVar16 = local_38;
              goto LAB_00212a8c;
            }
            uVar14 = *(ushort *)(puVar5 + uVar11 + 1) << 8 | *(ushort *)(puVar5 + uVar11 + 1) >> 8;
            if ((uVar14 < 0x80) || (uVar11 = uVar14 + uVar15, uVar12 < uVar11)) {
              iVar10 = 0x1bd7;
              goto LAB_00212a69;
            }
            iVar9 = mbedtls_x509_crt_parse_der(crt,puVar5 + uVar15,(ulong)uVar14);
            pmVar16 = local_38;
            if (iVar9 < -0x2580) {
              if (iVar9 != -0x262e) {
                if (iVar9 == -0x2880) {
                  uVar8 = 'P';
                }
                else {
LAB_00212edc:
                  uVar8 = '*';
                }
LAB_00212ede:
                mbedtls_ssl_send_alert_message(ssl,'\x02',uVar8);
                mbedtls_debug_print_ret
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                           ,0x1c12," mbedtls_x509_crt_parse_der",iVar9);
                goto LAB_00212a8c;
              }
            }
            else if (iVar9 != 0) {
              if (iVar9 != -0x2580) goto LAB_00212edc;
              uVar8 = '+';
              goto LAB_00212ede;
            }
            uVar12 = ssl->in_hslen;
          }
          mbedtls_debug_print_crt
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x1c19,"peer certificate",crt);
          iVar9 = 0;
          pmVar16 = local_38;
        }
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1b98,"bad certificate message");
LAB_0021297b:
        mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
        iVar9 = -0x7700;
        pmVar16 = crt;
      }
LAB_00212a8c:
      if (iVar9 != 0) goto LAB_002128e5;
      if (uVar2 == '\0') {
        iVar9 = 0;
      }
      else {
        local_48 = ssl->handshake->ciphersuite_info;
        if (ssl->f_vrfy == (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0) {
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x1c6d,"Use configuration-specific verification callback");
          pp_Var17 = &ssl->conf->f_vrfy;
          ppvVar13 = &ssl->conf->p_vrfy;
        }
        else {
          pp_Var17 = &ssl->f_vrfy;
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x1c69,"Use context-specific verification callback");
          ppvVar13 = &ssl->p_vrfy;
        }
        pmVar6 = ssl->conf;
        local_40 = pmVar6->ca_chain;
        iVar10 = mbedtls_x509_crt_verify_restartable
                           (crt,local_40,pmVar6->ca_crl,pmVar6->cert_profile,ssl->hostname,
                            &ssl->session_negotiate->verify_result,*pp_Var17,*ppvVar13,
                            (mbedtls_x509_crt_restart_ctx *)0x0);
        if (iVar10 != 0) {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x1ca2,"x509_verify_cert",iVar10);
        }
        local_38 = (mbedtls_x509_crt *)CONCAT44(local_38._4_4_,iVar10);
        iVar10 = mbedtls_pk_can_do(&pmVar16->pk,MBEDTLS_PK_ECKEY);
        bVar7 = true;
        if (iVar10 == 0) {
          iVar10 = (int)local_38;
        }
        else {
          local_68.priv_id = (pmVar16->pk).priv_id;
          local_68._20_4_ = *(undefined4 *)&(pmVar16->pk).field_0x14;
          local_68.pk_info = (pmVar16->pk).pk_info;
          local_68.pk_ctx = (pmVar16->pk).pk_ctx;
          mbedtls_pk_get_type(&local_68);
          if (*local_68.pk_ctx == 3) {
            iVar9 = mbedtls_ssl_check_curve_tls_id(ssl,0x17);
            iVar10 = (int)local_38;
            if (iVar9 != 0) goto LAB_00212c11;
          }
          else {
            iVar10 = (int)local_38;
            if (*local_68.pk_ctx == 0) {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                         ,0x1cbc,"invalid group ID");
              bVar7 = false;
              goto LAB_00212c4c;
            }
LAB_00212c11:
            puVar1 = &ssl->session_negotiate->verify_result;
            *puVar1 = *puVar1 | 0x10000;
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                       ,0x1cc3,"bad certificate (EC key curve)");
            if (iVar10 == 0) {
              iVar10 = -0x7a00;
            }
          }
          bVar7 = true;
        }
LAB_00212c4c:
        iVar9 = -0x6c00;
        if (bVar7) {
          iVar9 = mbedtls_ssl_check_cert_usage
                            (crt,local_48,(uint)(ssl->conf->endpoint == '\0'),
                             &ssl->session_negotiate->verify_result);
          if ((iVar9 != 0) &&
             (mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                         ,0x1cd0,"bad certificate (usage extensions)"), iVar10 == 0)) {
            iVar10 = -0x7a00;
          }
          iVar9 = iVar10;
          if (iVar10 == -0x7a00) {
            iVar9 = 0;
          }
          if (iVar10 == -0x2700) {
            iVar9 = 0;
          }
          if (uVar2 != '\x01') {
            iVar9 = iVar10;
          }
          if (uVar2 == '\x02' && local_40 == (mbedtls_x509_crt *)0x0) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                       ,0x1ce3,"got no CA chain");
            iVar9 = -0x7680;
          }
          if (iVar9 != 0) {
            uVar4 = ssl->session_negotiate->verify_result;
            uVar8 = '1';
            if (((((uVar4 >> 8 & 1) == 0) && (uVar8 = '*', (uVar4 & 4) == 0)) &&
                (uVar8 = '+', (uVar4 & 0x1b800) == 0)) &&
               ((uVar8 = '-', (uVar4 & 1) == 0 && (uVar8 = ',', (uVar4 & 2) == 0)))) {
              uVar8 = (char)((uVar4 & 8) >> 3) * '\x02' + '.';
            }
            mbedtls_ssl_send_alert_message(ssl,'\x02',uVar8);
          }
          if (ssl->session_negotiate->verify_result == 0) {
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                       ,0x1d0d,"Certificate verification flags clear");
          }
          else {
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                       ,0x1d0b,"! Certificate verification flags %08x");
          }
        }
      }
      if (iVar9 != 0) goto LAB_002128e5;
      ssl->session_negotiate->peer_cert = crt;
      format = "<= parse certificate";
      iVar10 = 0x1dc7;
      goto LAB_002128db;
    }
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1d6a,"mbedtls_ssl_read_record",iVar9);
  }
  else {
LAB_002128c0:
    format = "<= skip parse certificate";
    iVar10 = 0x1d5a;
LAB_002128db:
    iVar9 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,iVar10,format);
  }
  crt = (mbedtls_x509_crt *)0x0;
LAB_002128e5:
  if (iVar9 == 0) {
    ssl->state = ssl->state + 1;
  }
  if (crt != (mbedtls_x509_crt *)0x0) {
    mbedtls_x509_crt_free(crt);
    free(crt);
  }
  return iVar9;
}

Assistant:

int mbedtls_ssl_parse_certificate(mbedtls_ssl_context *ssl)
{
    int ret = 0;
    int crt_expected;
#if defined(MBEDTLS_SSL_SRV_C) && defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    const int authmode = ssl->handshake->sni_authmode != MBEDTLS_SSL_VERIFY_UNSET
                       ? ssl->handshake->sni_authmode
                       : ssl->conf->authmode;
#else
    const int authmode = ssl->conf->authmode;
#endif
    void *rs_ctx = NULL;
    mbedtls_x509_crt *chain = NULL;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> parse certificate"));

    crt_expected = ssl_parse_certificate_coordinate(ssl, authmode);
    if (crt_expected == SSL_CERTIFICATE_SKIP) {
        MBEDTLS_SSL_DEBUG_MSG(2, ("<= skip parse certificate"));
        goto exit;
    }

#if defined(MBEDTLS_SSL_ECP_RESTARTABLE_ENABLED)
    if (ssl->handshake->ecrs_enabled &&
        ssl->handshake->ecrs_state == ssl_ecrs_crt_verify) {
        chain = ssl->handshake->ecrs_peer_cert;
        ssl->handshake->ecrs_peer_cert = NULL;
        goto crt_verify;
    }
#endif

    if ((ret = mbedtls_ssl_read_record(ssl, 1)) != 0) {
        /* mbedtls_ssl_read_record may have sent an alert already. We
           let it decide whether to alert. */
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_read_record", ret);
        goto exit;
    }

#if defined(MBEDTLS_SSL_SRV_C)
    if (ssl_srv_check_client_no_crt_notification(ssl) == 0) {
        ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_MISSING;

        if (authmode != MBEDTLS_SSL_VERIFY_OPTIONAL) {
            ret = MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE;
        }

        goto exit;
    }
#endif /* MBEDTLS_SSL_SRV_C */

    /* Clear existing peer CRT structure in case we tried to
     * reuse a session but it failed, and allocate a new one. */
    ssl_clear_peer_cert(ssl->session_negotiate);

    chain = mbedtls_calloc(1, sizeof(mbedtls_x509_crt));
    if (chain == NULL) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("alloc(%" MBEDTLS_PRINTF_SIZET " bytes) failed",
                                  sizeof(mbedtls_x509_crt)));
        mbedtls_ssl_send_alert_message(ssl,
                                       MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_INTERNAL_ERROR);

        ret = MBEDTLS_ERR_SSL_ALLOC_FAILED;
        goto exit;
    }
    mbedtls_x509_crt_init(chain);

    ret = ssl_parse_certificate_chain(ssl, chain);
    if (ret != 0) {
        goto exit;
    }

#if defined(MBEDTLS_SSL_ECP_RESTARTABLE_ENABLED)
    if (ssl->handshake->ecrs_enabled) {
        ssl->handshake->ecrs_state = ssl_ecrs_crt_verify;
    }

crt_verify:
    if (ssl->handshake->ecrs_enabled) {
        rs_ctx = &ssl->handshake->ecrs_ctx;
    }
#endif

    ret = ssl_parse_certificate_verify(ssl, authmode,
                                       chain, rs_ctx);
    if (ret != 0) {
        goto exit;
    }

#if !defined(MBEDTLS_SSL_KEEP_PEER_CERTIFICATE)
    {
        unsigned char *crt_start, *pk_start;
        size_t crt_len, pk_len;

        /* We parse the CRT chain without copying, so
         * these pointers point into the input buffer,
         * and are hence still valid after freeing the
         * CRT chain. */

        crt_start = chain->raw.p;
        crt_len   = chain->raw.len;

        pk_start = chain->pk_raw.p;
        pk_len   = chain->pk_raw.len;

        /* Free the CRT structures before computing
         * digest and copying the peer's public key. */
        mbedtls_x509_crt_free(chain);
        mbedtls_free(chain);
        chain = NULL;

        ret = ssl_remember_peer_crt_digest(ssl, crt_start, crt_len);
        if (ret != 0) {
            goto exit;
        }

        ret = ssl_remember_peer_pubkey(ssl, pk_start, pk_len);
        if (ret != 0) {
            goto exit;
        }
    }
#else /* !MBEDTLS_SSL_KEEP_PEER_CERTIFICATE */
    /* Pass ownership to session structure. */
    ssl->session_negotiate->peer_cert = chain;
    chain = NULL;
#endif /* MBEDTLS_SSL_KEEP_PEER_CERTIFICATE */

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= parse certificate"));

exit:

    if (ret == 0) {
        ssl->state++;
    }

#if defined(MBEDTLS_SSL_ECP_RESTARTABLE_ENABLED)
    if (ret == MBEDTLS_ERR_SSL_CRYPTO_IN_PROGRESS) {
        ssl->handshake->ecrs_peer_cert = chain;
        chain = NULL;
    }
#endif

    if (chain != NULL) {
        mbedtls_x509_crt_free(chain);
        mbedtls_free(chain);
    }

    return ret;
}